

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O3

HPDF_STATUS HPDF_SaveToFile(HPDF_Doc pdf,char *file_name)

{
  HPDF_BOOL HVar1;
  HPDF_Stream stream;
  HPDF_STATUS HVar2;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 != 0) {
    stream = HPDF_FileWriter_New(pdf->mmgr,file_name);
    if (stream != (HPDF_Stream)0x0) {
      InternalSaveToStream(pdf,stream);
      HPDF_Stream_Free(stream);
    }
    HVar2 = HPDF_CheckError(&pdf->error);
    return HVar2;
  }
  return 0x1025;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_SaveToFile  (HPDF_Doc     pdf,
                  const char  *file_name)
{
    HPDF_Stream stream;

    HPDF_PTRACE ((" HPDF_SaveToFile\n"));

    if (!HPDF_HasDoc (pdf))
        return HPDF_INVALID_DOCUMENT;

    stream = HPDF_FileWriter_New (pdf->mmgr, file_name);
    if (!stream)
        return HPDF_CheckError (&pdf->error);

    InternalSaveToStream (pdf, stream);

    HPDF_Stream_Free (stream);

    return HPDF_CheckError (&pdf->error);
}